

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kaitaistream.cpp
# Opt level: O2

int32_t __thiscall kaitai::kstream::read_s4le(kstream *this)

{
  int32_t t;
  
  std::istream::read((char *)this->m_io,(long)&t);
  return t;
}

Assistant:

int32_t kaitai::kstream::read_s4le() {
    int32_t t;
    m_io->read(reinterpret_cast<char *>(&t), 4);
#if __BYTE_ORDER == __BIG_ENDIAN
    t = bswap_32(t);
#endif
    return t;
}